

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

ScriptContext * __thiscall Js::EntryPointInfo::GetScriptContext(EntryPointInfo *this)

{
  code *pcVar1;
  State SVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  SVar2 = GetState(this);
  if (SVar2 == CleanedUp) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x164,"(!IsCleanedUp())","!IsCleanedUp()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return (((this->library).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
}

Assistant:

ScriptContext* EntryPointInfo::GetScriptContext()
    {
        Assert(!IsCleanedUp());
        return this->library->GetScriptContext();
    }